

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_writer.cpp
# Opt level: O2

string * __thiscall
duckdb::BooleanStatisticsState::GetMinValue_abi_cxx11_
          (string *__return_storage_ptr__,BooleanStatisticsState *this)

{
  int iVar1;
  
  iVar1 = (*(this->super_ColumnWriterStatistics)._vptr_ColumnWriterStatistics[2])(this);
  if ((char)iVar1 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,&this->min,&this->max);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetMinValue() override {
		return HasStats() ? string(const_char_ptr_cast(&min), sizeof(bool)) : string();
	}